

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O2

void __thiscall
icu_63::anon_unknown_16::FCDUTF16NFDIterator::FCDUTF16NFDIterator
          (FCDUTF16NFDIterator *this,Normalizer2Impl *nfcImpl,UChar *text,UChar *textLimit)

{
  UnicodeString *this_00;
  short sVar1;
  int iVar2;
  UChar *src;
  char16_t *pcVar3;
  uint uVar4;
  UErrorCode errorCode;
  ReorderingBuffer r_buffer;
  UErrorCode local_74;
  ReorderingBuffer local_70;
  
  (this->super_UTF16NFDIterator).super_NFDIterator.index = -1;
  (this->super_UTF16NFDIterator).super_NFDIterator.length = 0;
  (this->super_UTF16NFDIterator).s = (UChar *)0x0;
  (this->super_UTF16NFDIterator).limit = (UChar *)0x0;
  (this->super_UTF16NFDIterator).super_NFDIterator.super_UObject._vptr_UObject =
       (_func_int **)&PTR__FCDUTF16NFDIterator_003a39b0;
  this_00 = &this->str;
  (this->str).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003b0268;
  (this->str).fUnion.fStackFields.fLengthAndFlags = 2;
  local_74 = U_ZERO_ERROR;
  src = Normalizer2Impl::makeFCD(nfcImpl,text,textLimit,(ReorderingBuffer *)0x0,&local_74);
  if (local_74 < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((src == textLimit) || ((textLimit == (UChar *)0x0 && (*src == L'\0')))) {
      (this->super_UTF16NFDIterator).s = text;
    }
    else {
      UnicodeString::setTo(this_00,text,(int32_t)((ulong)((long)src - (long)text) >> 1));
      local_70.start = (UChar *)0x0;
      local_70.reorderStart._0_5_ = 0;
      local_70.reorderStart._5_3_ = 0;
      local_70.limit._0_5_ = 0;
      local_70._37_8_ = 0;
      sVar1 = (this->str).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        uVar4 = (this->str).fUnion.fFields.fLength;
      }
      else {
        uVar4 = (int)sVar1 >> 5;
      }
      local_70.impl = nfcImpl;
      local_70.str = this_00;
      iVar2 = ReorderingBuffer::init(&local_70,(EVP_PKEY_CTX *)(ulong)uVar4);
      if ((char)iVar2 != '\0') {
        Normalizer2Impl::makeFCD(nfcImpl,src,textLimit,&local_70,&local_74);
      }
      ReorderingBuffer::~ReorderingBuffer(&local_70);
      if (U_ZERO_ERROR < local_74) {
        return;
      }
      pcVar3 = UnicodeString::getBuffer(this_00);
      (this->super_UTF16NFDIterator).s = pcVar3;
      sVar1 = (this->str).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar2 = (this->str).fUnion.fFields.fLength;
      }
      else {
        iVar2 = (int)sVar1 >> 5;
      }
      src = pcVar3 + iVar2;
    }
    (this->super_UTF16NFDIterator).limit = src;
  }
  return;
}

Assistant:

FCDUTF16NFDIterator(const Normalizer2Impl &nfcImpl, const UChar *text, const UChar *textLimit)
            : UTF16NFDIterator(NULL, NULL) {
        UErrorCode errorCode = U_ZERO_ERROR;
        const UChar *spanLimit = nfcImpl.makeFCD(text, textLimit, NULL, errorCode);
        if(U_FAILURE(errorCode)) { return; }
        if(spanLimit == textLimit || (textLimit == NULL && *spanLimit == 0)) {
            s = text;
            limit = spanLimit;
        } else {
            str.setTo(text, (int32_t)(spanLimit - text));
            {
                ReorderingBuffer r_buffer(nfcImpl, str);
                if(r_buffer.init(str.length(), errorCode)) {
                    nfcImpl.makeFCD(spanLimit, textLimit, &r_buffer, errorCode);
                }
            }
            if(U_SUCCESS(errorCode)) {
                s = str.getBuffer();
                limit = s + str.length();
            }
        }
    }